

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryRemove(InMemoryDirectory *this,PathPtr path)

{
  map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
  *this_00;
  size_t sVar1;
  Disposer DVar2;
  undefined1 uVar3;
  iterator __position;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  String *pSVar7;
  StringPtr name;
  Fault f;
  FsNode local_30;
  Disposer local_28;
  
  sVar5 = path.parts.size_;
  pSVar7 = path.parts.ptr;
  if (sVar5 == 1) {
    _::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
    sVar5 = (pSVar7->content).size_;
    if (sVar5 == 0) {
      local_30._vptr_FsNode = (_func_int **)0x240547;
    }
    else {
      local_30._vptr_FsNode = (_func_int **)(pSVar7->content).ptr;
    }
    local_28._vptr_Disposer = (_func_int **)(sVar5 + (sVar5 == 0));
    this_00 = &(this->impl).value.entries;
    f.exception = (Exception *)&this->impl;
    __position = std::
                 map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
                 ::find(this_00,(key_type *)&stack0xffffffffffffffd0);
    uVar3 = (_Rb_tree_header *)__position._M_node !=
            &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
    if ((bool)uVar3) {
      std::
      _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
      ::_M_erase_aux(&this_00->_M_t,(const_iterator)__position._M_node);
      lVar4 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
      (this->impl).value.lastModified.value.value = lVar4;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&f);
  }
  else if (sVar5 == 0) {
    uVar3 = 0;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x534,FAILED,(char *)0x0,"\"can\'t remove self from self\"",
               (char (*) [28])"can\'t remove self from self");
    _::Debug::Fault::~Fault(&f);
  }
  else {
    sVar1 = (pSVar7->content).size_;
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name.content.size_ = (size_t)pcVar6;
    name.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffd0,name,(int)sVar1 + (uint)(sVar1 == 0))
    ;
    DVar2._vptr_Disposer = local_28._vptr_Disposer;
    f.exception = (Exception *)local_30._vptr_FsNode;
    local_28._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&stack0xffffffffffffffd0);
    if (DVar2._vptr_Disposer == (_func_int **)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*DVar2._vptr_Disposer + 0xb0))(DVar2._vptr_Disposer,pSVar7 + 1,sVar5 - 1)
      ;
    }
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&f);
  }
  return (bool)uVar3;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't remove self from self") { return false; }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      auto iter = lock->entries.find(path[0]);
      if (iter == lock->entries.end()) {
        return false;
      } else {
        lock->entries.erase(iter);
        lock->modified();
        return true;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], WriteMode::MODIFY)) {
        return child->get()->tryRemove(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }